

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O3

int __thiscall PosixSerialPort::open(PosixSerialPort *this,char *__file,int __oflag,...)

{
  int iVar1;
  tcflag_t tVar2;
  int in_ECX;
  int in_R8D;
  speed_t __speed;
  string dev;
  long *local_90 [2];
  long local_80 [2];
  termios local_6c;
  
  iVar1 = ::open((this->super_SerialPort)._name._M_dataplus._M_p,0x902);
  this->_devfd = iVar1;
  if (iVar1 == -1) {
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/dev/","");
    std::__cxx11::string::_M_append
              ((char *)local_90,(ulong)(this->super_SerialPort)._name._M_dataplus._M_p);
    iVar1 = ::open((char *)local_90[0],0x902);
    this->_devfd = iVar1;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (iVar1 == -1) {
      return 0;
    }
    iVar1 = this->_devfd;
  }
  iVar1 = tcgetattr(iVar1,&local_6c);
  tVar2 = local_6c.c_cflag;
  if (iVar1 == -1) goto LAB_0010fba4;
  iVar1 = (int)__file;
  if (iVar1 < 0xe100) {
    if (iVar1 < 0x4b00) {
      __speed = 9;
      if (iVar1 != 0x4b0) {
        if (iVar1 != 0x2580) goto LAB_0010fba4;
        __speed = 0xd;
      }
    }
    else if (iVar1 == 0x4b00) {
      __speed = 0xe;
    }
    else {
      if (iVar1 != 0x9600) goto LAB_0010fba4;
      __speed = 0xf;
    }
  }
  else if (iVar1 < 0x38400) {
    if (iVar1 == 0xe100) {
      __speed = 0x1001;
    }
    else {
      if (iVar1 != 0x1c200) goto LAB_0010fba4;
      __speed = 0x1002;
    }
  }
  else if (iVar1 == 0x38400) {
    __speed = 0x1003;
  }
  else if (iVar1 == 0x70800) {
    __speed = 0x1004;
  }
  else {
    if (iVar1 != 0xe1000) goto LAB_0010fba4;
    __speed = 0x1007;
  }
  iVar1 = cfsetispeed(&local_6c,__speed);
  tVar2 = local_6c.c_cflag;
  if ((iVar1 != 0) || (iVar1 = cfsetospeed(&local_6c,__speed), tVar2 = local_6c.c_cflag, iVar1 != 0)
     ) goto LAB_0010fba4;
  if (__oflag == 7) {
    tVar2 = local_6c.c_cflag & 0xffffffcf | 0x8a0;
  }
  else {
    tVar2 = local_6c.c_cflag | 0x880;
    if (__oflag != 8) goto LAB_0010fba4;
    tVar2 = local_6c.c_cflag | 0x8b0;
  }
  if (in_ECX == 2) {
    tVar2 = tVar2 & 0xfffffcff | 0x100;
LAB_0010fc21:
    local_6c.c_iflag = local_6c.c_iflag | 0x30;
  }
  else {
    if (in_ECX == 1) {
      tVar2 = tVar2 | 0x300;
      goto LAB_0010fc21;
    }
    if (in_ECX != 0) goto LAB_0010fba4;
    tVar2 = tVar2 & 0xfffffcff;
    local_6c.c_iflag = local_6c.c_iflag & 0xffffffcf;
  }
  if (in_R8D == 2) {
    local_6c.c_cflag = tVar2 | 0x40;
  }
  else {
    if (in_R8D != 0) goto LAB_0010fba4;
    local_6c.c_cflag = tVar2 & 0xffffffbf;
  }
  local_6c.c_cflag = local_6c.c_cflag & 0x7fffffff;
  local_6c.c_iflag = local_6c.c_iflag & 0xffffe2fd;
  local_6c.c_lflag = local_6c.c_lflag & 0xffff7fe4;
  local_6c.c_oflag._0_1_ = (byte)local_6c.c_oflag & 0xfe;
  local_6c.c_cc[5] = '\0';
  local_6c.c_cc[6] = '\0';
  iVar1 = tcsetattr(this->_devfd,0,&local_6c);
  tVar2 = local_6c.c_cflag;
  if (iVar1 == 0) {
    return 1;
  }
LAB_0010fba4:
  local_6c.c_cflag = tVar2;
  (*(this->super_SerialPort)._vptr_SerialPort[3])(this);
  return 0;
}

Assistant:

bool
PosixSerialPort::open(int baud,
                      int data,
                      SerialPort::Parity parity,
                      SerialPort::StopBit stop)
{
    struct termios options;
    speed_t speed;
    // Try opening port assuming _name is full path. If it fails
    // try "/dev/" + _name
    _devfd = ::open(_name.c_str(), O_RDWR | O_NOCTTY | O_NDELAY);
    if (_devfd == -1)
    {
        std::string dev("/dev/");
        dev += _name;
        _devfd = ::open(dev.c_str(), O_RDWR | O_NOCTTY | O_NDELAY);
        if (_devfd == -1)
            return false;
    }

    if (tcgetattr(_devfd, &options) == -1)
    {
        close();
        return false;
    }

    switch (baud)
    {
    case 1200:
        speed = B1200;
        break;
    case 9600:
        speed = B9600;
        break;
    case 19200:
        speed = B19200;
        break;
    case 38400:
        speed = B38400;
        break;
    case 57600:
        speed = B57600;
        break;
    case 115200:
        speed = B115200;
        break;
    case 230400:
        speed = B230400;
        break;
    case 460800:
        speed = B460800;
        break;
    case 921600:
        speed = B921600;
        break;
    default:
        close();
        return false;
    }

    if (cfsetispeed(&options, speed) || cfsetospeed(&options, speed))
    {
        close();
        return false;
    }

    options.c_cflag |= (CLOCAL | CREAD);

    switch (data)
    {
        case 8:
            options.c_cflag &= ~CSIZE;
            options.c_cflag |= CS8;
            break;
        case 7:
            options.c_cflag &= ~CSIZE;
            options.c_cflag |= CS7;
            break;
        default:
            close();
            return false;
    }

    switch (parity)
    {
        case SerialPort::ParityNone:
            options.c_cflag &= ~PARENB;
            options.c_cflag &= ~PARODD;
            options.c_iflag &= ~(INPCK | ISTRIP);
            break;
        case SerialPort::ParityOdd:
            options.c_cflag |= PARENB;
            options.c_cflag |= PARODD;
            options.c_iflag |= (INPCK | ISTRIP);
            break;
        case SerialPort::ParityEven:
            options.c_cflag |= PARENB;
            options.c_cflag &= ~PARODD;
            options.c_iflag |= (INPCK | ISTRIP);
            break;
        default:
            close();
            return false;
    }

    switch (stop)
    {
    case StopBitOne:
        options.c_cflag &= ~CSTOPB;
        break;
    case StopBitTwo:
        options.c_cflag |= CSTOPB;
        break;
    default:
        close();
        return false;
    }

    // No hardware flow control
    options.c_cflag &= ~CRTSCTS;

    // No software flow control
    options.c_iflag &= ~(IXON | IXOFF | IXANY);

    // Raw input
    options.c_iflag &= ~(BRKINT | ICRNL);
    options.c_lflag &= ~(ICANON | IEXTEN | ECHO | ECHOE | ISIG);

    // Raw output
    options.c_oflag &= ~OPOST;

    // No wait time
    options.c_cc[VMIN]  = 0;
    options.c_cc[VTIME] = 0;

    if (tcsetattr(_devfd, TCSANOW, &options))
    {
        close();
        return false;
    }

    return true;
}